

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::SerializeWithCachedSizes
          (ImageFeatureType_ImageSizeRange *this,CodedOutputStream *output)

{
  if (this->widthrange_ != (SizeRange *)0x0 &&
      this != (ImageFeatureType_ImageSizeRange *)&_ImageFeatureType_ImageSizeRange_default_instance_
     ) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->widthrange_->super_MessageLite,output);
  }
  if (this->heightrange_ != (SizeRange *)0x0 &&
      this != (ImageFeatureType_ImageSizeRange *)&_ImageFeatureType_ImageSizeRange_default_instance_
     ) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->heightrange_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void ImageFeatureType_ImageSizeRange::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.SizeRange widthRange = 1;
  if (this->has_widthrange()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->widthrange_, output);
  }

  // .CoreML.Specification.SizeRange heightRange = 2;
  if (this->has_heightrange()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->heightrange_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ImageFeatureType.ImageSizeRange)
}